

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

string * __thiscall MinVR::VRDatumFloat::getValueString_abi_cxx11_(VRDatumFloat *this)

{
  const_reference pvVar1;
  string *in_RDI;
  char buffer [20];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  pvVar1 = std::__cxx11::list<float,_std::allocator<float>_>::front
                     ((list<float,_std::allocator<float>_> *)in_RDI);
  sprintf(&stack0xffffffffffffffd8,"%f",(double)*pvVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

std::string VRDatumFloat::getValueString() const {
  char buffer[20];
  sprintf(buffer, "%f", value.front());
  return std::string(buffer);
}